

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

AnonymousProgramSymbol *
slang::ast::AnonymousProgramSymbol::fromSyntax(Scope *scope,AnonymousProgramSyntax *syntax)

{
  Compilation *args;
  pointer ppMVar1;
  size_t sVar2;
  Symbol *args_00;
  AnonymousProgramSymbol *pAVar3;
  TransparentMemberSymbol *symbol;
  Symbol **ppSVar4;
  long lVar5;
  SourceLocation local_38;
  
  args = scope->compilation;
  local_38 = parsing::Token::location(&syntax->keyword);
  pAVar3 = BumpAllocator::
           emplace<slang::ast::AnonymousProgramSymbol,slang::ast::Compilation&,slang::SourceLocation>
                     (&args->super_BumpAllocator,args,&local_38);
  (pAVar3->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  ppMVar1 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
            _M_ptr;
  sVar2 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  for (lVar5 = 0; sVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
    Scope::addMembers(&pAVar3->super_Scope,*(SyntaxNode **)((long)ppMVar1 + lVar5));
  }
  ppSVar4 = &(pAVar3->super_Scope).firstMember;
  while (args_00 = *ppSVar4, args_00 != (Symbol *)0x0) {
    symbol = BumpAllocator::emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                       (&args->super_BumpAllocator,args_00);
    Scope::addMember(scope,&symbol->super_Symbol);
    ppSVar4 = &args_00->nextInScope;
  }
  return pAVar3;
}

Assistant:

AnonymousProgramSymbol& AnonymousProgramSymbol::fromSyntax(Scope& scope,
                                                           const AnonymousProgramSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<AnonymousProgramSymbol>(comp, syntax.keyword.location());
    result->setSyntax(syntax);

    for (auto member : syntax.members)
        result->addMembers(*member);

    // All members also get hoisted into the parent scope.
    for (auto member = result->getFirstMember(); member; member = member->getNextSibling())
        scope.addMember(*comp.emplace<TransparentMemberSymbol>(*member));

    return *result;
}